

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::process_restart(jpeg_decoder *this)

{
  uint uVar1;
  int iVar2;
  uint8 *puVar3;
  byte *pbVar4;
  uint8 uVar5;
  uint8 uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  uVar8 = 0x601;
  do {
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar7 = this->m_tem_flag;
      this->m_tem_flag = uVar7 ^ 1;
      bVar9 = uVar7 == 0;
    }
    else {
      puVar3 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = puVar3 + 1;
      uVar5 = *puVar3;
      this->m_in_buf_left = this->m_in_buf_left + -1;
      bVar9 = uVar5 == 0xff;
    }
    uVar8 = uVar8 - 1;
    if (bVar9) goto LAB_0014ed47;
  } while (1 < uVar8);
  uVar8 = 0;
LAB_0014ed47:
  if (uVar8 == 0) {
LAB_0014ef8d:
    stop_decoding(this,JPGD_BAD_RESTART_MARKER);
  }
  if ((int)uVar8 < 1) {
    bVar9 = false;
    uVar7 = 0;
  }
  else {
    do {
      if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
        uVar1 = this->m_tem_flag;
        this->m_tem_flag = uVar1 ^ 1;
        uVar7 = 0xd9;
        if (uVar1 == 0) {
          uVar7 = 0xff;
        }
      }
      else {
        pbVar4 = this->m_pIn_buf_ofs;
        this->m_pIn_buf_ofs = pbVar4 + 1;
        uVar7 = (uint)*pbVar4;
        this->m_in_buf_left = this->m_in_buf_left + -1;
      }
      if (uVar7 != 0xff) goto LAB_0014edcd;
      bVar9 = 1 < (int)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar9);
    uVar7 = 0xff;
    uVar8 = 0;
LAB_0014edcd:
    bVar9 = uVar8 == 0;
  }
  if ((bVar9) || (iVar2 = this->m_next_restart_num, uVar7 != iVar2 + 0xd0U)) goto LAB_0014ef8d;
  memset(this->m_last_dc_val,0,(long)this->m_comps_in_frame << 2);
  this->m_eob_run = 0;
  this->m_restarts_left = this->m_restart_interval;
  this->m_next_restart_num = iVar2 + 1U & 7;
  this->m_bits_left = 0;
  uVar8 = this->m_bit_buf << 0x10;
  this->m_bit_buf = uVar8;
  if (this->m_in_buf_left < 2) {
LAB_0014ee8d:
    uVar5 = get_octet(this);
    uVar6 = get_octet(this);
    this->m_bit_buf = this->m_bit_buf | (uint)CONCAT11(uVar5,uVar6);
  }
  else {
    puVar3 = this->m_pIn_buf_ofs;
    if ((*puVar3 == 0xff) || (puVar3[1] == 0xff)) goto LAB_0014ee8d;
    this->m_bit_buf = CONCAT11(*puVar3,puVar3[1]) | uVar8;
    this->m_in_buf_left = this->m_in_buf_left + -2;
    this->m_pIn_buf_ofs = puVar3 + 2;
  }
  iVar2 = this->m_bits_left;
  this->m_bit_buf = this->m_bit_buf << (-(char)iVar2 & 0x1fU);
  this->m_bits_left = iVar2 + 0x10;
  if (iVar2 < -0x10) goto LAB_0014ef9a;
  iVar2 = this->m_bits_left;
  this->m_bits_left = iVar2 + -0x10;
  if (0x10 < iVar2) {
    this->m_bit_buf = this->m_bit_buf << 0x10;
    return;
  }
  uVar8 = this->m_bit_buf << ((byte)iVar2 & 0x1f);
  this->m_bit_buf = uVar8;
  if (this->m_in_buf_left < 2) {
LAB_0014ef49:
    uVar5 = get_octet(this);
    uVar6 = get_octet(this);
    this->m_bit_buf = this->m_bit_buf | (uint)CONCAT11(uVar5,uVar6);
  }
  else {
    puVar3 = this->m_pIn_buf_ofs;
    if ((*puVar3 == 0xff) || (puVar3[1] == 0xff)) goto LAB_0014ef49;
    this->m_bit_buf = CONCAT11(*puVar3,puVar3[1]) | uVar8;
    this->m_in_buf_left = this->m_in_buf_left + -2;
    this->m_pIn_buf_ofs = puVar3 + 2;
  }
  iVar2 = this->m_bits_left;
  this->m_bit_buf = this->m_bit_buf << (-(char)iVar2 & 0x1fU);
  this->m_bits_left = iVar2 + 0x10;
  if (-0x11 < iVar2) {
    return;
  }
LAB_0014ef9a:
  __assert_fail("m_bits_left >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                ,0x203,"uint jpgd::jpeg_decoder::get_bits_no_markers(int)");
}

Assistant:

void jpeg_decoder::process_restart()
	{
		int i;
		int c = 0;

		// Align to a byte boundry
		// FIXME: Is this really necessary? get_bits_no_markers() never reads in markers!
		//get_bits_no_markers(m_bits_left & 7);

		// Let's scan a little bit to find the marker, but not _too_ far.
		// 1536 is a "fudge factor" that determines how much to scan.
		for (i = 1536; i > 0; i--)
			if (get_char() == 0xFF)
				break;

		if (i == 0)
			stop_decoding(JPGD_BAD_RESTART_MARKER);

		for (; i > 0; i--)
			if ((c = get_char()) != 0xFF)
				break;

		if (i == 0)
			stop_decoding(JPGD_BAD_RESTART_MARKER);

		// Is it the expected marker? If not, something bad happened.
		if (c != (m_next_restart_num + M_RST0))
			stop_decoding(JPGD_BAD_RESTART_MARKER);

		// Reset each component's DC prediction values.
		memset(&m_last_dc_val, 0, m_comps_in_frame * sizeof(uint));

		m_eob_run = 0;

		m_restarts_left = m_restart_interval;

		m_next_restart_num = (m_next_restart_num + 1) & 7;

		// Get the bit buffer going again...

		m_bits_left = 16;
		get_bits_no_markers(16);
		get_bits_no_markers(16);
	}